

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O1

void __thiscall hbm::streaming::StreamClient::StreamClient(StreamClient *this)

{
  SocketNonblocking::SocketNonblocking(&this->m_streamSocket);
  (this->m_address)._M_dataplus._M_p = (pointer)&(this->m_address).field_2;
  (this->m_address)._M_string_length = 0;
  (this->m_address).field_2._M_local_buf[0] = '\0';
  (this->m_httpPath)._M_dataplus._M_p = (pointer)&(this->m_httpPath).field_2;
  (this->m_httpPath)._M_string_length = 0;
  (this->m_httpPath).field_2._M_local_buf[0] = '\0';
  (this->m_streamId)._M_dataplus._M_p = (pointer)&(this->m_streamId).field_2;
  (this->m_streamId)._M_string_length = 0;
  (this->m_streamId).field_2._M_local_buf[0] = '\0';
  (this->m_streamPort)._M_dataplus._M_p = (pointer)&(this->m_streamPort).field_2;
  (this->m_streamPort)._M_string_length = 0;
  (this->m_streamPort).field_2._M_local_buf[0] = '\0';
  (this->m_controlPort)._M_dataplus._M_p = (pointer)&(this->m_controlPort).field_2;
  (this->m_controlPort)._M_string_length = 0;
  (this->m_controlPort).field_2._M_local_buf[0] = '\0';
  timeInfo::timeInfo(&this->m_initialTime);
  (this->m_initialTimeScale)._M_dataplus._M_p = (pointer)&(this->m_initialTimeScale).field_2;
  (this->m_initialTimeScale)._M_string_length = 0;
  (this->m_initialTimeScale).field_2._M_local_buf[0] = '\0';
  (this->m_initialTimeEpoch)._M_dataplus._M_p = (pointer)&(this->m_initialTimeEpoch).field_2;
  (this->m_initialTimeEpoch)._M_string_length = 0;
  (this->m_initialTimeEpoch).field_2._M_local_buf[0] = '\0';
  this->m_pSignalContainer = (SignalContainer *)0x0;
  *(undefined8 *)&(this->m_streamMetaCb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_streamMetaCb).super__Function_base._M_functor + 8) = 0;
  (this->m_streamMetaCb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_streamMetaCb)._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

StreamClient::StreamClient()
			: m_streamSocket()
			, m_address()
			, m_httpPath()
			, m_streamId()
			, m_streamPort()
			, m_controlPort()
			, m_initialTime()
			, m_initialTimeScale()
			, m_initialTimeEpoch()
			, m_pSignalContainer(NULL)
			, m_streamMetaCb()
		{
		}